

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req_test.c
# Opt level: O2

void test_req_identity(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  char *n;
  uint16_t p;
  nng_socket s;
  
  nVar1 = nng_req0_open((nng_socket *)((long)&n + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x1a,"%s: expected success, got %s (%d)","nng_req0_open(&s)",pcVar3,nVar1)
  ;
  if (iVar2 != 0) {
    nVar1 = nng_socket_proto_id(n._4_4_,(uint16_t *)((long)&n + 2));
    pcVar3 = nng_strerror(nVar1);
    iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0x1b,"%s: expected success, got %s (%d)","nng_socket_proto_id(s, &p)",
                           pcVar3,nVar1);
    if (iVar2 != 0) {
      acutest_check_((uint)(n._2_2_ == 0x30),
                     "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                     ,0x1c,"%s","p == REQ0_SELF");
      nVar1 = nng_socket_peer_id(n._4_4_,(uint16_t *)((long)&n + 2));
      pcVar3 = nng_strerror(nVar1);
      iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                             "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                             ,0x1d,"%s: expected success, got %s (%d)","nng_socket_peer_id(s, &p)",
                             pcVar3,nVar1);
      if (iVar2 != 0) {
        acutest_check_((uint)(n._2_2_ == 0x31),
                       "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                       ,0x1e,"%s","p == REQ0_PEER");
        nVar1 = nng_socket_proto_name(n._4_4_,&local_38);
        pcVar3 = nng_strerror(nVar1);
        iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                               "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                               ,0x1f,"%s: expected success, got %s (%d)",
                               "nng_socket_proto_name(s, &n)",pcVar3,nVar1);
        pcVar3 = local_38;
        if (iVar2 != 0) {
          iVar2 = strcmp(local_38,"req");
          acutest_check_((uint)(iVar2 == 0),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                         ,0x20,"%s == %s",pcVar3,"req",nVar1);
          nVar1 = nng_socket_peer_name(n._4_4_,&local_38);
          pcVar3 = nng_strerror(nVar1);
          iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                 ,0x21,"%s: expected success, got %s (%d)",
                                 "nng_socket_peer_name(s, &n)",pcVar3,nVar1);
          if (iVar2 != 0) {
            iVar2 = strcmp(local_38,"rep");
            acutest_check_((uint)(iVar2 == 0),
                           "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                           ,0x22,"%s == %s",local_38,"rep",nVar1);
            nVar1 = nng_socket_close(n._4_4_);
            pcVar3 = nng_strerror(nVar1);
            iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                                   "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/sp/protocol/reqrep0/req_test.c"
                                   ,0x23,"%s: expected success, got %s (%d)","nng_socket_close(s)",
                                   pcVar3,nVar1);
            if (iVar2 != 0) {
              return;
            }
          }
        }
      }
    }
  }
  acutest_abort_();
}

Assistant:

static void
test_req_identity(void)
{
	nng_socket  s;
	uint16_t    p;
	const char *n;

	NUTS_PASS(nng_req0_open(&s));
	NUTS_PASS(nng_socket_proto_id(s, &p));
	NUTS_TRUE(p == REQ0_SELF);
	NUTS_PASS(nng_socket_peer_id(s, &p));
	NUTS_TRUE(p == REQ0_PEER); // 49
	NUTS_PASS(nng_socket_proto_name(s, &n));
	NUTS_MATCH(n, REQ0_SELF_NAME);
	NUTS_PASS(nng_socket_peer_name(s, &n));
	NUTS_MATCH(n, REQ0_PEER_NAME);
	NUTS_CLOSE(s);
}